

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O3

Interval * tcu::anon_unknown_4::chooseInterval(YesNoMaybe choice,Interval *no,Interval *yes)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Interval *in_RAX;
  Interval *pIVar3;
  undefined4 *in_RDI;
  ulong uVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  
  if (choice == YES) {
    pIVar3 = (Interval *)yes->m_hi;
    *(Interval **)(in_RDI + 4) = pIVar3;
    uVar6 = *(undefined4 *)yes;
    uVar7 = *(undefined4 *)&yes->field_0x4;
    uVar8 = *(undefined4 *)&yes->m_lo;
    uVar9 = *(undefined4 *)((long)&yes->m_lo + 4);
  }
  else {
    if (choice == MAYBE) {
      pIVar3 = (Interval *)&DAT_00000001;
      if (no->m_hasNaN == false) {
        pIVar3 = (Interval *)(ulong)*(uint *)yes;
      }
      *(char *)in_RDI = (char)pIVar3;
      uVar4 = -(ulong)(no->m_lo <= yes->m_lo);
      uVar5 = -(ulong)(yes->m_hi <= no->m_hi);
      uVar2 = (ulong)no->m_hi & uVar5;
      auVar10._0_8_ = ~uVar4 & (ulong)yes->m_lo;
      auVar10._8_8_ = ~uVar5 & (ulong)yes->m_hi;
      auVar1._8_4_ = (int)uVar2;
      auVar1._0_8_ = (ulong)no->m_lo & uVar4;
      auVar1._12_4_ = (int)(uVar2 >> 0x20);
      *(undefined1 (*) [16])(in_RDI + 2) = auVar10 | auVar1;
      return pIVar3;
    }
    if (choice != NO) {
      *(undefined1 *)in_RDI = 0;
      *(undefined8 *)(in_RDI + 2) = 0x7ff0000000000000;
      *(undefined8 *)(in_RDI + 4) = 0xfff0000000000000;
      return in_RAX;
    }
    pIVar3 = (Interval *)no->m_hi;
    *(Interval **)(in_RDI + 4) = pIVar3;
    uVar6 = *(undefined4 *)no;
    uVar7 = *(undefined4 *)&no->field_0x4;
    uVar8 = *(undefined4 *)&no->m_lo;
    uVar9 = *(undefined4 *)((long)&no->m_lo + 4);
  }
  *in_RDI = uVar6;
  in_RDI[1] = uVar7;
  in_RDI[2] = uVar8;
  in_RDI[3] = uVar9;
  return pIVar3;
}

Assistant:

Interval chooseInterval(YesNoMaybe choice, const Interval& no, const Interval& yes)
{
	switch (choice)
	{
		case NO:	return no;
		case YES:	return yes;
		case MAYBE:	return no | yes;
		default:	DE_FATAL("Impossible case");
	}

	return Interval();
}